

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createTriangleSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  pointer pvVar4;
  Vec3fa *pVVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 uVar8;
  Node *pNVar9;
  int iVar10;
  TriangleMeshNode *this_00;
  Vec3fa *pVVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_01;
  uint theta;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float phif;
  Triangle local_bc;
  float local_b0;
  float local_ac;
  size_t local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  Ref<embree::SceneGraph::MaterialNode> local_88;
  float local_80;
  uint local_7c;
  int local_78;
  float local_74;
  Vec3fa *local_70;
  ulong local_68;
  long local_60;
  Node *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint p00;
  
  local_ac = radius;
  local_a8 = N;
  local_70 = center;
  local_58 = (Node *)this;
  this_00 = (TriangleMeshNode *)::operator_new(0xd8);
  local_88 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_88.ptr != (MaterialNode *)0x0) {
    (*((local_88.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this_00,&local_88,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  uVar25 = extraout_XMM0_Db;
  uVar26 = extraout_XMM0_Dc;
  uVar27 = extraout_XMM0_Dd;
  if (local_88.ptr != (MaterialNode *)0x0) {
    (*((local_88.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
    uVar25 = extraout_XMM0_Db_00;
    uVar26 = extraout_XMM0_Dc_00;
    uVar27 = extraout_XMM0_Dd_00;
  }
  iVar21 = (int)local_a8;
  uVar20 = iVar21 * 2;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = (ulong)((iVar21 + 1) * uVar20);
  uVar14 = pvVar4->size_alloced;
  uVar16 = uVar14;
  if ((uVar14 < uVar19) && (uVar15 = uVar14, uVar16 = uVar19, uVar14 != 0)) {
    for (; uVar16 = uVar15, uVar15 < uVar19; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
    }
  }
  if (uVar19 < pvVar4->size_active) {
    pvVar4->size_active = uVar19;
  }
  if (uVar14 == uVar16) {
    pvVar4->size_active = uVar19;
  }
  else {
    pVVar5 = pvVar4->items;
    pVVar11 = (Vec3fa *)alignedMalloc(uVar16 << 4,0x10);
    pvVar4->items = pVVar11;
    lVar12 = 0;
    for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
      puVar1 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      lVar12 = lVar12 + 0x10;
    }
    alignedFree(pVVar5);
    pvVar4->size_active = uVar19;
    pvVar4->size_alloced = uVar16;
    uVar25 = extraout_XMM0_Db_01;
    uVar26 = extraout_XMM0_Dc_01;
    uVar27 = extraout_XMM0_Dd_01;
  }
  local_50 = (ulong)uVar20;
  fVar22 = (float)local_50;
  auVar28._4_4_ = uVar25;
  auVar28._0_4_ = fVar22;
  auVar28._8_4_ = uVar26;
  auVar28._12_4_ = uVar27;
  auVar29._4_4_ = uVar25;
  auVar29._0_4_ = fVar22;
  auVar29._8_4_ = uVar26;
  auVar29._12_4_ = uVar27;
  auVar29 = rcpss(auVar28,auVar29);
  local_74 = (2.0 - fVar22 * auVar29._0_4_) * auVar29._0_4_;
  fVar22 = (float)(local_a8 & 0xffffffff);
  auVar30._4_4_ = uVar25;
  auVar30._0_4_ = fVar22;
  auVar30._8_4_ = uVar26;
  auVar30._12_4_ = uVar27;
  auVar6._4_4_ = uVar25;
  auVar6._0_4_ = fVar22;
  auVar6._8_4_ = uVar26;
  auVar6._12_4_ = uVar27;
  auVar29 = rcpss(auVar30,auVar6);
  local_80 = (2.0 - fVar22 * auVar29._0_4_) * auVar29._0_4_;
  _p00 = (ulong)(uVar20 - 1);
  this_01 = &this_00->triangles;
  local_7c = uVar20 * (int)local_a8;
  local_48 = (ulong)(((int)local_a8 + -1) * uVar20);
  local_78 = uVar20 + 1;
  local_68 = (ulong)(uint)(iVar21 * -2);
  local_98 = 0;
  local_60 = 0;
  uVar14 = 0;
  local_90 = (ulong)uVar20;
  while( true ) {
    uVar16 = local_50;
    pNVar9 = local_58;
    pVVar5 = local_70;
    if ((uint)local_a8 < (uint)uVar14) break;
    fVar22 = (float)uVar14 * 3.1415927 * local_80;
    local_40 = (ulong)((uint)uVar14 * (int)local_90);
    local_a0 = uVar14;
    for (uVar19 = 0; uVar14 = local_90, uVar16 != uVar19; uVar19 = uVar19 + 1) {
      fVar23 = ((float)(uVar19 & 0xffffffff) + (float)(uVar19 & 0xffffffff)) * 3.1415927 * local_74;
      fVar3 = (pVVar5->field_0).m128[0];
      local_b0 = sinf(fVar22);
      local_b0 = local_b0 * local_ac;
      fVar24 = sinf(fVar23);
      uVar20 = (int)local_60 + (int)uVar19;
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar20].field_0.m128[0] =
           fVar24 * local_b0 + fVar3;
      fVar3 = (pVVar5->field_0).m128[1];
      fVar24 = cosf(fVar22);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar20].field_0.m128[1] =
           fVar24 * local_ac + fVar3;
      fVar3 = (pVVar5->field_0).m128[2];
      local_b0 = sinf(fVar22);
      local_b0 = local_b0 * local_ac;
      fVar23 = cosf(fVar23);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar20].field_0.m128[2] =
           fVar23 * local_b0 + fVar3;
    }
    iVar21 = (int)local_90;
    if ((int)local_a0 != 0) {
      uVar16 = local_a0 & 0xffffffff;
      if ((int)local_a0 == 1) {
        while (iVar10 = (int)uVar16, local_78 != iVar10) {
          local_bc.v1 = (uint)_p00;
          local_bc.v0 = local_bc.v1 + iVar10;
          local_bc.v2 = (int)(uVar16 % (uVar14 & 0xffffffff)) + iVar21;
          std::
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_01,&local_bc);
          uVar16 = (ulong)(iVar10 + 1);
        }
      }
      else if ((int)local_a0 == (uint)local_a8) {
        uVar16 = 0;
        while (iVar10 = (int)uVar16, iVar21 != iVar10) {
          local_bc.v1 = (int)local_48 + iVar10;
          uVar16 = (ulong)(iVar10 + 1);
          local_bc.v2 = (int)(uVar16 % (uVar14 & 0xffffffff)) + (int)local_48;
          local_bc.v0 = local_7c;
          std::
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_01,&local_bc);
        }
      }
      else {
        iVar10 = ((int)local_a0 + -1) * iVar21;
        iVar13 = 0;
        uVar14 = local_98 & 0xffffffff;
        uVar20 = 1;
        while( true ) {
          iVar21 = (int)local_90;
          if ((int)local_68 == iVar13) break;
          uVar7 = (uint)uVar14;
          uVar18 = (int)local_68 + uVar7;
          iVar21 = (int)((ulong)uVar20 % (local_90 & 0xffffffff));
          uVar17 = iVar21 + (int)local_40;
          local_bc.v0 = uVar7;
          local_bc.v1 = uVar18;
          local_bc.v2 = uVar17;
          std::
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_01,&local_bc);
          local_bc.v0 = iVar21 + iVar10;
          local_bc.v1 = uVar17;
          local_bc.v2 = uVar18;
          std::
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_01,&local_bc);
          uVar20 = uVar20 + 1;
          iVar13 = iVar13 + -1;
          uVar14 = (ulong)(uVar7 + 1);
        }
      }
    }
    uVar14 = (ulong)((int)local_a0 + 1);
    local_60 = local_60 + local_50;
    local_98 = (ulong)(uint)((int)local_98 + iVar21);
  }
  (local_58->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar9;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTriangleSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p01,p11,p00));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }